

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

shared_ptr<duckdb::PreparedStatementData,_true> __thiscall
duckdb::ClientContext::CreatePreparedStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          values)

{
  StatementProperties *this_00;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  SQLStatement *this_01;
  undefined8 uVar2;
  int iVar3;
  pointer pSVar4;
  type this_02;
  type this_03;
  ExplainStatement *pEVar5;
  PreparedStatementData *pPVar6;
  pointer pLVar7;
  type binder;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t iVar8;
  idx_t extraout_RDX_03;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  pointer *__ptr;
  Binder *__p;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *plan_p;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *in_R9;
  _Hash_node_base *p_Var10;
  bool is_explain_analyze_p;
  shared_ptr<duckdb::PreparedStatementData,_true> sVar11;
  type logical_plan;
  StatementType statement_type;
  PhysicalPlanGenerator physical_planner;
  Planner logical_planner;
  undefined1 local_2d8 [32];
  pointer local_2b8;
  Binder *local_2b0;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_2a8;
  optional_ptr<duckdb::LogicalOperator,_true> local_2a0;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  local_298;
  undefined1 local_290 [32];
  undefined1 local_270 [64];
  pointer local_230 [3];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_218;
  undefined1 local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_158;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140;
  shared_ptr<duckdb::Binder,_true> local_108;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8;
  undefined2 local_80;
  bool bStack_7e;
  undefined5 uStack_7d;
  idx_t iStack_78;
  bool local_70;
  
  local_298.ptr = in_R9;
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)values.ptr);
  local_2d8[0x1f] = pSVar4->type;
  local_178 = (undefined1  [8])0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::PreparedStatementData,std::allocator<duckdb::PreparedStatementData>,duckdb::StatementType&>
            (local_170,(PreparedStatementData **)local_178,
             (allocator<duckdb::PreparedStatementData> *)local_270,local_2d8 + 0x1f);
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_178;
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_170[0]._M_pi;
  if (local_170[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_170[0]._M_pi)->_M_use_count = (local_170[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_170[0]._M_pi)->_M_use_count = (local_170[0]._M_pi)->_M_use_count + 1;
    }
  }
  local_2d8._16_8_ = this;
  if (local_170[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170[0]._M_pi);
  }
  this_02 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator*
                      ((unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>
                        *)(lock + 0x44));
  this_03 = shared_ptr<duckdb::QueryProfiler,_true>::operator*(&this_02->profiler);
  _Var1._M_head_impl =
       (statement->
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  local_290._0_8_ = (pointer)(local_290 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,_Var1._M_head_impl,
             (long)&(statement[1].
                     super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                     .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl)->
                    _vptr_SQLStatement + (long)_Var1._M_head_impl);
  this_01 = (SQLStatement *)((values.ptr)->_M_h)._M_buckets;
  if ((this_01 == (SQLStatement *)0x0) || (this_01->type != EXPLAIN_STATEMENT)) {
    is_explain_analyze_p = false;
  }
  else {
    pEVar5 = SQLStatement::Cast<duckdb::ExplainStatement>(this_01);
    is_explain_analyze_p = pEVar5->explain_type == EXPLAIN_ANALYZE;
  }
  QueryProfiler::StartQuery(this_03,(string *)local_290,is_explain_analyze_p,true);
  if ((pointer)local_290._0_8_ != (pointer)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  QueryProfiler::StartPhase(this_03,PLANNER);
  local_2a0.ptr = (LogicalOperator *)lock;
  Planner::Planner((Planner *)local_178,(ClientContext *)lock);
  if (local_298.ptr !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
       *)0x0) {
    optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
    ::CheckValid(&local_298);
    p_Var10 = ((local_298.ptr)->_M_h)._M_before_begin._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      do {
        Value::Value((Value *)local_270,(Value *)(p_Var10 + 5));
        LogicalType::LogicalType((LogicalType *)local_230,(LogicalType *)(p_Var10 + 0xd));
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,duckdb::BoundParameterData>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_140,p_Var10 + 1,(Value *)local_270);
        LogicalType::~LogicalType((LogicalType *)local_230);
        Value::~Value((Value *)local_270);
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
  }
  local_2a8._M_head_impl = (SQLStatement *)((values.ptr)->_M_h)._M_buckets;
  ((values.ptr)->_M_h)._M_buckets = (__buckets_ptr)0x0;
  Planner::CreatePlan((Planner *)local_178,
                      (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)&local_2a8);
  if ((ClientContext *)local_2a8._M_head_impl != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                 &(local_2a8._M_head_impl)->_vptr_SQLStatement)->__weak_this_).internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  local_2a8._M_head_impl = (SQLStatement *)0x0;
  QueryProfiler::EndPhase(this_03);
  local_2d8._8_8_ = local_178;
  local_178 = (undefined1  [8])0x0;
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_2d8._16_8_);
  this_00 = &pPVar6->properties;
  if ((StatementProperties *)&local_f0 != this_00) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,&local_f0);
    if ((StatementProperties *)&local_f0 != this_00) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(pPVar6->properties).modified_databases,&local_b8);
    }
  }
  (pPVar6->properties).always_require_rebind = local_70;
  (pPVar6->properties).requires_valid_transaction = (bool)(char)local_80;
  (pPVar6->properties).allow_stream_result = (bool)SUB21(local_80,1);
  (pPVar6->properties).bound_all_parameters = bStack_7e;
  (pPVar6->properties).return_type = (char)uStack_7d;
  *(int *)&(pPVar6->properties).field_0x74 = SUB54(uStack_7d,1);
  (pPVar6->properties).parameter_count = iStack_78;
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_2d8._16_8_);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar6->names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_2d8._16_8_);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pPVar6->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_158);
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_2d8._16_8_);
  __p = (Binder *)&stack0xffffffffffffff98;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(pPVar6->value_map)._M_h);
  iVar8 = extraout_RDX;
  if (bStack_7e != false) {
    if (*(bool *)((long)&local_2a0.ptr[2].children.
                         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4) == true) {
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)(local_2d8 + 8));
      iVar3 = (*pLVar7->_vptr_LogicalOperator[10])(pLVar7);
      if ((char)iVar3 != '\0') {
        QueryProfiler::StartPhase(this_03,ALL_OPTIMIZERS);
        binder = shared_ptr<duckdb::Binder,_true>::operator*(&local_108);
        Optimizer::Optimizer((Optimizer *)local_270,binder,(ClientContext *)local_2a0.ptr);
        local_2b0 = (Binder *)local_2d8._8_8_;
        local_2d8._8_8_ = (Binder *)0x0;
        plan_p = (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_270;
        Optimizer::Optimize((Optimizer *)local_2d8,plan_p);
        uVar2 = local_2d8._8_8_;
        local_2d8._8_8_ = local_2d8._0_8_;
        local_2d8._0_8_ = (ClientContext *)0x0;
        iVar8 = extraout_RDX_00;
        if ((Binder *)uVar2 != (Binder *)0x0) {
          (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)uVar2)->__weak_this_).
                             internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 8))();
          iVar8 = extraout_RDX_01;
        }
        if ((ClientContext *)local_2d8._0_8_ != (ClientContext *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_2d8._0_8_)->
                      __weak_this_).internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
          iVar8 = extraout_RDX_02;
        }
        local_2d8._0_8_ = (Binder *)0x0;
        if (local_2b0 != (Binder *)0x0) {
          (**(code **)(*(long *)&(local_2b0->super_enable_shared_from_this<duckdb::Binder>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))
                    ((PrivateAllocatorData *)local_2b0,(data_ptr_t)plan_p,iVar8);
        }
        local_2b0 = (Binder *)0x0;
        QueryProfiler::EndPhase(this_03);
        if (local_218._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_218._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_218._M_head_impl = (LogicalOperator *)0x0;
        local_270._16_8_ = &PTR__ExpressionRewriter_019aada8;
        if (local_230[0] != (pointer)0x0) {
          operator_delete(local_230[0]);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
                   *)(local_270 + 0x18));
      }
    }
    QueryProfiler::StartPhase(this_03,PHYSICAL_PLANNER);
    PhysicalPlanGenerator::PhysicalPlanGenerator
              ((PhysicalPlanGenerator *)local_270,(ClientContext *)local_2a0.ptr);
    local_2b8 = (pointer)local_2d8._8_8_;
    local_2d8._8_8_ = (Binder *)0x0;
    PhysicalPlanGenerator::Plan
              ((PhysicalPlanGenerator *)local_2d8,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_270);
    pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_2d8._16_8_);
    __p = (Binder *)local_2d8._0_8_;
    local_2d8._0_8_ = (ClientContext *)0x0;
    ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
              ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
               &pPVar6->physical_plan,(pointer)__p);
    uVar2 = local_2d8._0_8_;
    iVar8 = extraout_RDX_03;
    if ((ClientContext *)local_2d8._0_8_ != (ClientContext *)0x0) {
      PhysicalPlan::~PhysicalPlan((PhysicalPlan *)local_2d8._0_8_);
      operator_delete((void *)uVar2);
      iVar8 = extraout_RDX_04;
    }
    local_2d8._0_8_ = (Binder *)0x0;
    if ((Binder *)local_2b8 != (Binder *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &local_2b8->
                               super_unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>_>)->
                             __weak_this_).internal.
                             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))
                ((PrivateAllocatorData *)local_2b8,(data_ptr_t)__p,iVar8);
    }
    local_2b8 = (pointer)0x0;
    QueryProfiler::EndPhase(this_03);
    PhysicalPlanGenerator::~PhysicalPlanGenerator((PhysicalPlanGenerator *)local_270);
    iVar8 = extraout_RDX_05;
  }
  if ((Binder *)local_2d8._8_8_ != (Binder *)0x0) {
    (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)local_2d8._8_8_)->
                           __weak_this_).internal.
                           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))
              ((PrivateAllocatorData *)local_2d8._8_8_,(data_ptr_t)__p,iVar8);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&stack0xffffffffffffff98);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f0);
  if (local_108.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_158);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  _Var9._M_pi = extraout_RDX_06;
  if (local_178 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_178)[1])();
    _Var9._M_pi = extraout_RDX_07;
  }
  sVar11.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  sVar11.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_2d8._16_8_;
  return (shared_ptr<duckdb::PreparedStatementData,_true>)
         sVar11.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<PreparedStatementData>
ClientContext::CreatePreparedStatementInternal(ClientContextLock &lock, const string &query,
                                               unique_ptr<SQLStatement> statement,
                                               optional_ptr<case_insensitive_map_t<BoundParameterData>> values) {
	StatementType statement_type = statement->type;
	auto result = make_shared_ptr<PreparedStatementData>(statement_type);

	auto &profiler = QueryProfiler::Get(*this);
	profiler.StartQuery(query, IsExplainAnalyze(statement.get()), true);
	profiler.StartPhase(MetricsType::PLANNER);
	Planner logical_planner(*this);
	if (values) {
		auto &parameter_values = *values;
		for (auto &value : parameter_values) {
			logical_planner.parameter_data.emplace(value.first, BoundParameterData(value.second));
		}
	}

	logical_planner.CreatePlan(std::move(statement));
	D_ASSERT(logical_planner.plan || !logical_planner.properties.bound_all_parameters);
	profiler.EndPhase();

	auto logical_plan = std::move(logical_planner.plan);
	// extract the result column names from the plan
	result->properties = logical_planner.properties;
	result->names = logical_planner.names;
	result->types = logical_planner.types;
	result->value_map = std::move(logical_planner.value_map);
	if (!logical_planner.properties.bound_all_parameters) {
		return result;
	}
#ifdef DEBUG
	logical_plan->Verify(*this);
#endif
	if (config.enable_optimizer && logical_plan->RequireOptimizer()) {
		profiler.StartPhase(MetricsType::ALL_OPTIMIZERS);
		Optimizer optimizer(*logical_planner.binder, *this);
		logical_plan = optimizer.Optimize(std::move(logical_plan));
		D_ASSERT(logical_plan);
		profiler.EndPhase();

#ifdef DEBUG
		logical_plan->Verify(*this);
#endif
	}

	// Convert the logical query plan into a physical query plan.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER);
	PhysicalPlanGenerator physical_planner(*this);
	result->physical_plan = physical_planner.Plan(std::move(logical_plan));
	profiler.EndPhase();
	D_ASSERT(result->physical_plan);
	return result;
}